

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

void __thiscall CVmObjDate::load_image_data(CVmObjDate *this,char *ptr,size_t siz)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,this);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  (this->super_CVmObject).ext_ = pcVar2;
  *(undefined4 *)pcVar2 = *(undefined4 *)ptr;
  *(undefined4 *)(pcVar2 + 4) = *(undefined4 *)(ptr + 4);
  return;
}

Assistant:

void CVmObjDate::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* allocate the extension */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* read the image data */
    ext->dayno = osrp4s(ptr);
    ext->daytime = osrp4(ptr+4);
}